

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void scale_patch_(double *alpha,Integer *ndim,double *patch1,Integer *LO1,Integer *HI1,
                 Integer *DIMS1)

{
  int n;
  int hi1 [7];
  int dims1 [7];
  int lo1 [7];
  int aiStack_98 [8];
  int local_78 [8];
  int local_58 [10];
  
  n = (int)*ndim;
  if (n < 8) {
    f2c_adj_indices(HI1,aiStack_98,n);
    f2c_adj_indices(LO1,local_58,n);
    f2c_copy_indices(DIMS1,local_78,n);
    scale_patch_internal(*alpha,n,patch1,local_58,aiStack_98,local_78);
    return;
  }
  __assert_fail("(int)*ndim <= GA_MAX_DIM",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/global/testing/util.c"
                ,0x155,
                "void scale_patch_(double *, Integer *, double *, Integer *, Integer *, Integer *)")
  ;
}

Assistant:

void FATR scale_patch_(double *alpha, Integer *ndim, double *patch1, 
                 Integer LO1[], Integer HI1[], Integer DIMS1[])
{
int hi1[GA_MAX_DIM], lo1[GA_MAX_DIM], dims1[GA_MAX_DIM];

    assert((int)*ndim <= GA_MAX_DIM);
    f2c_adj_indices(HI1, hi1, (int)*ndim);
    f2c_adj_indices(LO1, lo1, (int)*ndim);
    f2c_copy_indices(DIMS1, dims1, (int)*ndim);
    scale_patch_internal(*alpha, (int)*ndim, patch1, lo1, hi1, dims1);
}